

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btorsimbv.c
# Opt level: O2

BtorSimBitVector * btorsim_bv_nand(BtorSimBitVector *a,BtorSimBitVector *b)

{
  uint uVar1;
  BtorSimBitVector *bv;
  ulong uVar2;
  
  bv = btorsim_bv_new(a->width);
  uVar1 = a->len;
  for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
    (&bv[1].width)[uVar2] = ~((&b[1].width)[uVar2] & (&a[1].width)[uVar2]);
  }
  set_rem_bits_to_zero(bv);
  return bv;
}

Assistant:

BtorSimBitVector *
btorsim_bv_nand (const BtorSimBitVector *a, const BtorSimBitVector *b)
{
  assert (a);
  assert (b);
  assert (a->len == b->len);
  assert (a->width == b->width);

  uint32_t i;
  BtorSimBitVector *res;

  res = btorsim_bv_new (a->width);
  for (i = 0; i < a->len; i++) res->bits[i] = ~(a->bits[i] & b->bits[i]);

  set_rem_bits_to_zero (res);
  assert (rem_bits_zero_dbg (res));
  return res;
}